

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

Maybe<kj::Own<capnp::ClientHook>_> __thiscall
capnp::_::BuilderArena::LocalCapTable::extractCap(LocalCapTable *this,uint index)

{
  size_t sVar1;
  anon_class_1_0_00000001 *f;
  uint in_EDX;
  ClientHook *extraout_RDX;
  undefined4 in_register_00000034;
  Maybe<kj::Own<capnp::ClientHook>_> MVar3;
  uint index_local;
  LocalCapTable *this_local;
  ClientHook *pCVar2;
  
  sVar1 = kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::size
                    ((Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)
                     (CONCAT44(in_register_00000034,index) + 8));
  if (in_EDX < sVar1) {
    f = (anon_class_1_0_00000001 *)
        kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::operator[]
                  ((Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)
                   (CONCAT44(in_register_00000034,index) + 8),(ulong)in_EDX);
    MVar3 = kj::Maybe<kj::Own<capnp::ClientHook>_>::
            map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_arena_c__:317:32)>
                      ((Maybe<kj::Own<capnp::ClientHook>_> *)this,f);
    pCVar2 = MVar3.ptr.ptr;
  }
  else {
    kj::Maybe<kj::Own<capnp::ClientHook>_>::Maybe
              ((Maybe<kj::Own<capnp::ClientHook>_> *)this,(void *)0x0);
    pCVar2 = extraout_RDX;
  }
  MVar3.ptr.ptr = pCVar2;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook>_>)MVar3.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> BuilderArena::LocalCapTable::extractCap(uint index) {
  if (index < capTable.size()) {
    return capTable[index].map([](kj::Own<ClientHook>& cap) { return cap->addRef(); });
  } else {
    return nullptr;
  }
}